

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_example.cpp
# Opt level: O3

void getdir(string *dir,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *files)

{
  DIR *__dirp;
  int *piVar1;
  ostream *poVar2;
  dirent *pdVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  __dirp = opendir((dir->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error(",6);
    piVar1 = __errno_location();
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") opening ",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(dir->_M_dataplus)._M_p,dir->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  pdVar3 = readdir(__dirp);
  if (pdVar3 != (dirent *)0x0) {
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pdVar3->d_name,pdVar3->d_name + sVar4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_38,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pdVar3 = readdir(__dirp);
    } while (pdVar3 != (dirent *)0x0);
  }
  closedir(__dirp);
  return;
}

Assistant:

void getdir (std::string dir, std::vector<std::string> &files)
{
    DIR *dp;
    struct dirent *dirp;
    if((dp  = opendir(dir.c_str())) == NULL) {
        std::cout << "Error(" << errno << ") opening " << dir << std::endl;
    }

    while ((dirp = readdir(dp)) != NULL) {
        files.push_back(std::string(dirp->d_name));
    }
    closedir(dp);
}